

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

ch_string * ch_table_find_string(ch_table *table,char *value,size_t size)

{
  ch_table_entry *pcVar1;
  ch_string *pcVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  ch_string *unaff_RBP;
  uint uVar6;
  uint uVar7;
  
  if (table->size == 0) {
    unaff_RBP = (ch_string *)0x0;
  }
  else {
    uVar4 = ch_hash_string(value,size);
    uVar6 = table->capacity - 1;
    uVar7 = uVar6 & uVar4;
    pcVar1 = table->entries;
    do {
      pcVar2 = pcVar1[uVar7].key;
      if (pcVar2 == (ch_string *)0x0) {
        if (pcVar1[uVar7].value.type != PRIMITIVE_NULL) goto LAB_00102deb;
        bVar3 = false;
        unaff_RBP = (ch_string *)0x0;
      }
      else {
        if (((pcVar2->size == size) &&
            (iVar5 = bcmp(pcVar2->value,value,size), pcVar2->hash == uVar4)) && (iVar5 == 0)) {
          bVar3 = false;
          unaff_RBP = pcVar2;
        }
        else {
          bVar3 = true;
        }
        if (bVar3) {
LAB_00102deb:
          uVar7 = uVar7 + 1 & uVar6;
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      }
    } while (bVar3);
  }
  return unaff_RBP;
}

Assistant:

ch_string *ch_table_find_string(ch_table *table, const char *value,
                                size_t size) {
  if (table->size == 0)
    return NULL;

  uint32_t hash = ch_hash_string(value, size);
  uint32_t index = hash & (table->capacity - 1);
  for (;;) {
    ch_table_entry *entry = &table->entries[index];
    if (entry->key == NULL) {

      if (IS_NULL(entry->value))
        return NULL;
    } else  {
    // } else if (entry->key->size == size && entry->key->hash == hash &&
    //            memcmp(entry->key->value, value, size) == 0) {
      bool a = entry->key->size == size;
      bool b = entry->key->hash == hash;
      bool result = memcmp(entry->key->value, value, size) == 0;
      if (a && b && result) {
        return entry->key;
      }

    }

    index = (index + 1) & (table->capacity - 1);
  }
}